

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_get_topic(connectdata *conn,char **topic,size_t *topiclen)

{
  ssl_backend_data *__s;
  CURLcode CVar1;
  size_t sVar2;
  
  __s = conn[2].proxy_ssl[1].backend;
  sVar2 = strlen((char *)__s);
  if (1 < sVar2) {
    CVar1 = Curl_urldecode((Curl_easy *)conn,(char *)((long)&__s->ctx + 1),0,topic,topiclen,
                           REJECT_NADA);
    return CVar1;
  }
  Curl_failf((Curl_easy *)conn,"Error: No topic specified.");
  return CURLE_URL_MALFORMAT;
}

Assistant:

static CURLcode mqtt_get_topic(struct connectdata *conn,
                               char **topic, size_t *topiclen)
{
  CURLcode result = CURLE_OK;
  char *path = conn->data->state.up.path;

  if(strlen(path) > 1) {
    result = Curl_urldecode(conn->data, path + 1, 0, topic, topiclen,
                            REJECT_NADA);
  }
  else {
    failf(conn->data, "Error: No topic specified.");
    result = CURLE_URL_MALFORMAT;
  }
  return result;
}